

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void CAnonFuncSymtabPrep::enum_for_anon2(void *ctx,CTcSymbol *sym)

{
  long *plVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  long *in_RSI;
  undefined8 *in_RDI;
  CAnonFuncSymtabPrep *self;
  
  plVar1 = (long *)*in_RDI;
  pcVar2 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x2c906e);
  sVar3 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x2c907d);
  lVar4 = (**(code **)(*plVar1 + 0x10))(plVar1,pcVar2,sVar3);
  if (lVar4 != 0) {
    (**(code **)(*in_RSI + 0xa0))();
  }
  return;
}

Assistant:

static void enum_for_anon2(void *ctx, CTcSymbol *sym)
    {
        /* get 'this' from the context */
        CAnonFuncSymtabPrep *self = (CAnonFuncSymtabPrep *)ctx;
        
        /*
         *   If this symbol isn't in the anonymous function's local symbol
         *   table, the anonymous function didn't end up using it.  The fact
         *   that it's in the enclosing table in this case simply means that
         *   it's a context variable in the enclosing context.  
         */
        if (self->enc_symtab->find_direct(
            sym->get_sym(), sym->get_sym_len()) == 0)
            return;
        
        /* ask the symbol to apply the necessary conversion */
        sym->finish_ctx_var_conv();
    }